

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_panel_alloc_space(nk_rect *bounds,nk_context *ctx)

{
  int *piVar1;
  nk_window *win;
  nk_panel *pnVar2;
  int in_ECX;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x46d5,"void nk_panel_alloc_space(struct nk_rect *, const struct nk_context *)");
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    pnVar2 = win->layout;
    if (pnVar2 != (nk_panel *)0x0) {
      if ((pnVar2->row).columns <= (pnVar2->row).index) {
        nk_panel_alloc_row(ctx,win);
      }
      nk_layout_widget_space(bounds,ctx,(nk_window *)0x1,in_ECX);
      piVar1 = &(pnVar2->row).index;
      *piVar1 = *piVar1 + 1;
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x46d7,"void nk_panel_alloc_space(struct nk_rect *, const struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x46d6,"void nk_panel_alloc_space(struct nk_rect *, const struct nk_context *)");
}

Assistant:

NK_LIB void
nk_panel_alloc_space(struct nk_rect *bounds, const struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    /* check if the end of the row has been hit and begin new row if so */
    win = ctx->current;
    layout = win->layout;
    if (layout->row.index >= layout->row.columns)
        nk_panel_alloc_row(ctx, win);

    /* calculate widget position and size */
    nk_layout_widget_space(bounds, ctx, win, nk_true);
    layout->row.index++;
}